

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_ssl.cc
# Opt level: O0

long ssl_callback_ctrl(BIO *bio,int cmd,BIO_info_cb *fp)

{
  SSL *s;
  BIO *b;
  SSL *ssl;
  BIO_info_cb *fp_local;
  int cmd_local;
  BIO *bio_local;
  
  s = (SSL *)get_ssl(bio);
  if (s == (SSL *)0x0) {
    bio_local = (BIO *)0x0;
  }
  else if (cmd == 0xe) {
    bio_local = (BIO *)0xffffffffffffffff;
  }
  else {
    b = SSL_get_rbio(s);
    bio_local = (BIO *)BIO_callback_ctrl(b,cmd,(fp *)fp);
  }
  return (long)bio_local;
}

Assistant:

static long ssl_callback_ctrl(BIO *bio, int cmd, BIO_info_cb *fp) {
  SSL *ssl = get_ssl(bio);
  if (ssl == NULL) {
    return 0;
  }

  switch (cmd) {
    case BIO_CTRL_SET_CALLBACK:
      return -1;

    default:
      return BIO_callback_ctrl(SSL_get_rbio(ssl), cmd, fp);
  }
}